

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O0

void __thiscall
ary::SceneAnchor::SceneAnchor(SceneAnchor *this,string *name,Matx44f *transform,int group)

{
  int group_local;
  Matx44f *transform_local;
  string *name_local;
  SceneAnchor *this_local;
  
  this->_vptr_SceneAnchor = (_func_int **)&PTR__SceneAnchor_001819d8;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  memcpy(&this->transform,transform,0x40);
  this->group = group;
  return;
}

Assistant:

SceneAnchor::SceneAnchor(const string name, const Matx44f& transform, int group) : name(name), transform(transform), group(group) {

}